

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::unpack_etc1_block
               (void *pETC1_block,uint *pDst_pixels_rgba,bool preserve_alpha)

{
  bool bVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 packed_delta3;
  uint uVar4;
  uint table_idx;
  color_quad_u8 *local_b0;
  color_quad_u8 *local_98;
  uint local_8c;
  uint local_88;
  uint y_5;
  uint y_4;
  uint y_3;
  uint y_2;
  uint y_1;
  uint y;
  uint16 base_color4_1;
  uint16 base_color4_0;
  uint16 delta_color3;
  uint16 base_color5;
  bool success;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  uint table_index1;
  uint table_index0;
  bool flip_flag;
  bool diff_flag;
  etc1_block *block;
  color_quad_u8 *pDst;
  bool preserve_alpha_local;
  uint *pDst_pixels_rgba_local;
  void *pETC1_block_local;
  
  bVar1 = etc1_block::get_diff_bit((etc1_block *)pETC1_block);
  bVar2 = etc1_block::get_flip_bit((etc1_block *)pETC1_block);
  uVar4 = etc1_block::get_inten_table((etc1_block *)pETC1_block,0);
  table_idx = etc1_block::get_inten_table((etc1_block *)pETC1_block,1);
  local_98 = subblock_colors1 + 2;
  do {
    color_quad_u8::color_quad_u8(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != subblock_colors0 + 2);
  local_b0 = (color_quad_u8 *)&base_color4_0;
  do {
    color_quad_u8::color_quad_u8(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != subblock_colors1 + 2);
  base_color4_1._1_1_ = true;
  if (bVar1) {
    uVar3 = etc1_block::get_base5_color((etc1_block *)pETC1_block);
    packed_delta3 = etc1_block::get_delta3_color((etc1_block *)pETC1_block);
    etc1_block::get_diff_subblock_colors(subblock_colors1 + 2,uVar3,uVar4);
    base_color4_1._1_1_ =
         etc1_block::get_diff_subblock_colors
                   ((color_quad_u8 *)&base_color4_0,uVar3,packed_delta3,table_idx);
  }
  else {
    uVar3 = etc1_block::get_base4_color((etc1_block *)pETC1_block,0);
    etc1_block::get_abs_subblock_colors(subblock_colors1 + 2,uVar3,uVar4);
    uVar3 = etc1_block::get_base4_color((etc1_block *)pETC1_block,1);
    etc1_block::get_abs_subblock_colors((color_quad_u8 *)&base_color4_0,uVar3,table_idx);
  }
  block = (etc1_block *)pDst_pixels_rgba;
  if (preserve_alpha) {
    if (bVar2) {
      for (y_2 = 0; y_2 < 2; y_2 = y_2 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,y_2);
        color_quad_u8::set_rgb((color_quad_u8 *)block,subblock_colors1 + (ulong)uVar4 + 2);
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,y_2);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)((long)&block->field_0 + 4),subblock_colors1 + (ulong)uVar4 + 2)
        ;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,y_2);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)block->m_low_color,subblock_colors1 + (ulong)uVar4 + 2);
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,y_2);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)block->m_selectors,subblock_colors1 + (ulong)uVar4 + 2);
        block = block + 1;
      }
      for (y_3 = 2; y_3 < 4; y_3 = y_3 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,y_3);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)block,(color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,y_3);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)((long)&block->field_0 + 4),
                   (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,y_3);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)block->m_low_color,
                   (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,y_3);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)block->m_selectors,
                   (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
        block = block + 1;
      }
    }
    else {
      for (y_4 = 0; y_4 < 4; y_4 = y_4 + 1) {
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,y_4);
        color_quad_u8::set_rgb((color_quad_u8 *)block,subblock_colors1 + (ulong)uVar4 + 2);
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,y_4);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)((long)&block->field_0 + 4),subblock_colors1 + (ulong)uVar4 + 2)
        ;
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,y_4);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)block->m_low_color,
                   (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
        uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,y_4);
        color_quad_u8::set_rgb
                  ((color_quad_u8 *)block->m_selectors,
                   (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
        block = block + 1;
      }
    }
  }
  else if (bVar2) {
    for (y_5 = 0; y_5 < 2; y_5 = y_5 + 1) {
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,y_5);
      color_quad_u8::operator=((color_quad_u8 *)block,subblock_colors1 + (ulong)uVar4 + 2);
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,y_5);
      color_quad_u8::operator=
                ((color_quad_u8 *)((long)&block->field_0 + 4),subblock_colors1 + (ulong)uVar4 + 2);
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,y_5);
      color_quad_u8::operator=
                ((color_quad_u8 *)block->m_low_color,subblock_colors1 + (ulong)uVar4 + 2);
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,y_5);
      color_quad_u8::operator=
                ((color_quad_u8 *)block->m_selectors,subblock_colors1 + (ulong)uVar4 + 2);
      block = block + 1;
    }
    for (local_88 = 2; local_88 < 4; local_88 = local_88 + 1) {
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,local_88);
      color_quad_u8::operator=
                ((color_quad_u8 *)block,(color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,local_88);
      color_quad_u8::operator=
                ((color_quad_u8 *)((long)&block->field_0 + 4),
                 (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,local_88);
      color_quad_u8::operator=
                ((color_quad_u8 *)block->m_low_color,
                 (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,local_88);
      color_quad_u8::operator=
                ((color_quad_u8 *)block->m_selectors,
                 (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
      block = block + 1;
    }
  }
  else {
    for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,0,local_8c);
      color_quad_u8::operator=((color_quad_u8 *)block,subblock_colors1 + (ulong)uVar4 + 2);
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,1,local_8c);
      color_quad_u8::operator=
                ((color_quad_u8 *)((long)&block->field_0 + 4),subblock_colors1 + (ulong)uVar4 + 2);
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,2,local_8c);
      color_quad_u8::operator=
                ((color_quad_u8 *)block->m_low_color,
                 (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
      uVar4 = etc1_block::get_selector((etc1_block *)pETC1_block,3,local_8c);
      color_quad_u8::operator=
                ((color_quad_u8 *)block->m_selectors,
                 (color_quad_u8 *)(&base_color4_0 + (ulong)uVar4 * 2));
      block = block + 1;
    }
  }
  return base_color4_1._1_1_;
}

Assistant:

bool unpack_etc1_block(const void* pETC1_block, unsigned int* pDst_pixels_rgba, bool preserve_alpha)
        {
            color_quad_u8* pDst = reinterpret_cast<color_quad_u8*>(pDst_pixels_rgba);
            const etc1_block& block = *static_cast<const etc1_block*>(pETC1_block);

            const bool diff_flag = block.get_diff_bit();
            const bool flip_flag = block.get_flip_bit();
            const uint table_index0 = block.get_inten_table(0);
            const uint table_index1 = block.get_inten_table(1);

            color_quad_u8 subblock_colors0[4];
            color_quad_u8 subblock_colors1[4];
            bool success = true;

            if (diff_flag)
            {
                const uint16 base_color5 = block.get_base5_color();
                const uint16 delta_color3 = block.get_delta3_color();
                etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

                if (!etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
                {
                    success = false;
                }
            }
            else
            {
                const uint16 base_color4_0 = block.get_base4_color(0);
                etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

                const uint16 base_color4_1 = block.get_base4_color(1);
                etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
            }

            if (preserve_alpha)
            {
                if (flip_flag)
                {
                    for (uint y = 0; y < 2; y++)
                    {
                        pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
                        pDst += 4;
                    }

                    for (uint y = 2; y < 4; y++)
                    {
                        pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                        pDst += 4;
                    }
                }
                else
                {
                    for (uint y = 0; y < 4; y++)
                    {
                        pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
                        pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
                        pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
                        pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
                        pDst += 4;
                    }
                }
            }
            else
            {
                if (flip_flag)
                {
                    // 0000
                    // 0000
                    // 1111
                    // 1111
                    for (uint y = 0; y < 2; y++)
                    {
                        pDst[0] = subblock_colors0[block.get_selector(0, y)];
                        pDst[1] = subblock_colors0[block.get_selector(1, y)];
                        pDst[2] = subblock_colors0[block.get_selector(2, y)];
                        pDst[3] = subblock_colors0[block.get_selector(3, y)];
                        pDst += 4;
                    }

                    for (uint y = 2; y < 4; y++)
                    {
                        pDst[0] = subblock_colors1[block.get_selector(0, y)];
                        pDst[1] = subblock_colors1[block.get_selector(1, y)];
                        pDst[2] = subblock_colors1[block.get_selector(2, y)];
                        pDst[3] = subblock_colors1[block.get_selector(3, y)];
                        pDst += 4;
                    }
                }
                else
                {
                    // 0011
                    // 0011
                    // 0011
                    // 0011
                    for (uint y = 0; y < 4; y++)
                    {
                        pDst[0] = subblock_colors0[block.get_selector(0, y)];
                        pDst[1] = subblock_colors0[block.get_selector(1, y)];
                        pDst[2] = subblock_colors1[block.get_selector(2, y)];
                        pDst[3] = subblock_colors1[block.get_selector(3, y)];
                        pDst += 4;
                    }
                }
            }

            return success;
        }